

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpringConstraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofSpringConstraint::internalUpdateSprings
          (btGeneric6DofSpringConstraint *this,btConstraintInfo2 *info)

{
  float fVar1;
  float fVar2;
  btScalar *pbVar3;
  float *in_RSI;
  long in_RDI;
  float x;
  btScalar bVar4;
  float fVar5;
  btScalar velFactor_1;
  btScalar force_1;
  btScalar delta_1;
  btScalar currPos_1;
  btScalar velFactor;
  btScalar force;
  btScalar delta;
  btScalar currPos;
  int i;
  int local_14;
  
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    if ((*(byte *)(in_RDI + 0x535 + (long)local_14) & 1) != 0) {
      pbVar3 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x500));
      x = (pbVar3[local_14] - *(float *)(in_RDI + 0x53c + (long)local_14 * 4)) *
          *(float *)(in_RDI + 0x554 + (long)local_14 * 4);
      fVar5 = *in_RSI;
      fVar1 = *(float *)(in_RDI + 0x56c + (long)local_14 * 4);
      fVar2 = in_RSI[0x16];
      pbVar3 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x330));
      pbVar3[local_14] = ((fVar5 * fVar1) / (float)(int)fVar2) * x;
      bVar4 = btFabs(x);
      fVar5 = *in_RSI;
      pbVar3 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x340));
      pbVar3[local_14] = bVar4 / fVar5;
    }
  }
  for (local_14 = 0; local_14 < 3; local_14 = local_14 + 1) {
    if ((*(byte *)(in_RDI + 0x535 + (long)(local_14 + 3)) & 1) != 0) {
      pbVar3 = btVector3::operator_cast_to_float_((btVector3 *)(in_RDI + 0x4c0));
      fVar5 = -(pbVar3[local_14] - *(float *)(in_RDI + 0x53c + (long)(local_14 + 3) * 4)) *
              *(float *)(in_RDI + 0x554 + (long)(local_14 + 3) * 4);
      *(float *)(in_RDI + (long)local_14 * 0x40 + 900) =
           ((*in_RSI * *(float *)(in_RDI + 0x56c + (long)(local_14 + 3) * 4)) /
           (float)(int)in_RSI[0x16]) * fVar5;
      bVar4 = btFabs(fVar5);
      *(float *)(in_RDI + (long)local_14 * 0x40 + 0x388) = bVar4 / *in_RSI;
    }
  }
  return;
}

Assistant:

void btGeneric6DofSpringConstraint::internalUpdateSprings(btConstraintInfo2* info)
{
	// it is assumed that calculateTransforms() have been called before this call
	int i;
	//btVector3 relVel = m_rbB.getLinearVelocity() - m_rbA.getLinearVelocity();
	for(i = 0; i < 3; i++)
	{
		if(m_springEnabled[i])
		{
			// get current position of constraint
			btScalar currPos = m_calculatedLinearDiff[i];
			// calculate difference
			btScalar delta = currPos - m_equilibriumPoint[i];
			// spring force is (delta * m_stiffness) according to Hooke's Law
			btScalar force = delta * m_springStiffness[i];
			btScalar velFactor = info->fps * m_springDamping[i] / btScalar(info->m_numIterations);
			m_linearLimits.m_targetVelocity[i] =  velFactor * force;
			m_linearLimits.m_maxMotorForce[i] =  btFabs(force) / info->fps;
		}
	}
	for(i = 0; i < 3; i++)
	{
		if(m_springEnabled[i + 3])
		{
			// get current position of constraint
			btScalar currPos = m_calculatedAxisAngleDiff[i];
			// calculate difference
			btScalar delta = currPos - m_equilibriumPoint[i+3];
			// spring force is (-delta * m_stiffness) according to Hooke's Law
			btScalar force = -delta * m_springStiffness[i+3];
			btScalar velFactor = info->fps * m_springDamping[i+3] / btScalar(info->m_numIterations);
			m_angularLimits[i].m_targetVelocity = velFactor * force;
			m_angularLimits[i].m_maxMotorForce = btFabs(force) / info->fps;
		}
	}
}